

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O0

TString * luaS_createlngstrobj(lua_State *L,size_t l)

{
  size_t totalsize_00;
  TString *pTVar1;
  TString *ts;
  size_t totalsize;
  size_t l_local;
  lua_State *L_local;
  
  totalsize_00 = luaS_sizelngstr(l,-1);
  pTVar1 = createstrobj(L,totalsize_00,'\x14',L->l_G->seed);
  (pTVar1->u).lnglen = l;
  pTVar1->shrlen = -1;
  pTVar1->contents = (char *)&pTVar1->falloc;
  pTVar1->contents[l] = '\0';
  return pTVar1;
}

Assistant:

TString *luaS_createlngstrobj (lua_State *L, size_t l) {
  size_t totalsize = luaS_sizelngstr(l, LSTRREG);
  TString *ts = createstrobj(L, totalsize, LUA_VLNGSTR, G(L)->seed);
  ts->u.lnglen = l;
  ts->shrlen = LSTRREG;  /* signals that it is a regular long string */
  ts->contents = cast_charp(ts) + offsetof(TString, falloc);
  ts->contents[l] = '\0';  /* ending 0 */
  return ts;
}